

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  bool bVar1;
  uint32_t begin;
  Inst *pIVar2;
  PatchList PVar3;
  Frag FVar4;
  PatchList local_78;
  PatchList pl;
  uint32_t local_68;
  bool bStack_64;
  uint32_t uStack_58;
  int id;
  uint32_t local_50;
  bool bStack_4c;
  bool nongreedy_local;
  Compiler *this_local;
  Frag a_local;
  uint32_t local_10;
  undefined4 uStack_c;
  
  this_local._0_4_ = a.begin;
  this_local._4_4_ = a.end.head;
  a_local.begin = a.end.tail;
  a_local.end.head = a._12_4_;
  bVar1 = IsNoMatch(a);
  if (bVar1) {
    FVar4 = Nop(this);
    _uStack_58 = FVar4._0_8_;
    a_local.end.tail = uStack_58;
    a_local.nullable = id._0_1_;
    a_local._13_3_ = id._1_3_;
    local_50 = FVar4.end.tail;
    local_10 = local_50;
    bStack_4c = FVar4.nullable;
    uStack_c = CONCAT31(uStack_c._1_3_,bStack_4c);
  }
  else {
    begin = AllocInst(this,1);
    if ((int)begin < 0) {
      FVar4 = NoMatch(this);
      pl = FVar4._0_8_;
      a_local._8_8_ = pl;
      local_68 = FVar4.end.tail;
      local_10 = local_68;
      bStack_64 = FVar4.nullable;
      uStack_c = CONCAT31(uStack_c._1_3_,bStack_64);
    }
    else {
      if (nongreedy) {
        pIVar2 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,begin);
        Prog::Inst::InitAlt(pIVar2,0,(uint32_t)this_local);
        local_78 = PatchList::Mk(begin << 1);
      }
      else {
        pIVar2 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,begin);
        Prog::Inst::InitAlt(pIVar2,(uint32_t)this_local,0);
        local_78 = PatchList::Mk(begin << 1 | 1);
      }
      pIVar2 = PODArray<re2::Prog::Inst>::data(&this->inst_);
      PVar3.tail = a_local.begin;
      PVar3.head = this_local._4_4_;
      PVar3 = PatchList::Append(pIVar2,local_78,PVar3);
      Frag::Frag((Frag *)&a_local.end.tail,begin,PVar3,true);
    }
  }
  FVar4.end.tail = local_10;
  FVar4._0_8_ = a_local._8_8_;
  FVar4._12_4_ = uStack_c;
  return FVar4;
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_.data(), pl, a.end), true);
}